

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O3

void NCONF_free(CONF *conf)

{
  code *local_28;
  undefined8 local_20;
  
  if (conf != (CONF *)0x0) {
    local_28 = section_free_arg;
    local_20 = 0;
    OPENSSL_lh_doall_arg((_LHASH *)conf->meth_data,lh_CONF_SECTION_call_doall_arg,&local_28);
    OPENSSL_lh_free((_LHASH *)conf->meth_data);
    local_28 = value_free_arg;
    local_20 = 0;
    OPENSSL_lh_doall_arg((_LHASH *)conf->meth,lh_CONF_VALUE_call_doall_arg,&local_28);
    OPENSSL_lh_free((_LHASH *)conf->meth);
    OPENSSL_free(conf);
  }
  return;
}

Assistant:

void NCONF_free(CONF *conf) {
  if (conf == NULL) {
    return;
  }

  lh_CONF_SECTION_doall_arg(conf->sections, section_free_arg, NULL);
  lh_CONF_SECTION_free(conf->sections);
  lh_CONF_VALUE_doall_arg(conf->values, value_free_arg, NULL);
  lh_CONF_VALUE_free(conf->values);
  OPENSSL_free(conf);
}